

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

const_reference __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos)

{
  const_reference pcVar1;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  pcVar1 = data_at(this,pos);
  return pcVar1;
}

Assistant:

at(size_type pos) const {
#if nssv_CONFIG_NO_EXCEPTIONS
			assert(pos < size());
#else
			if (pos >= size()) {
				throw std::out_of_range("nonst::string_view::at()");
			}
#endif
			return data_at(pos);
		}